

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

GdlLanguageDefn * __thiscall GrcSymbolTableEntry::LanguageDefnData(GrcSymbolTableEntry *this)

{
  bool bVar1;
  GdlDefn *pGVar2;
  GrcSymbolTableEntry *in_RDI;
  GdlLanguageDefn *plang;
  GdlLanguageDefn *local_30;
  GdlLanguageDefn *local_8;
  
  bVar1 = HasData(in_RDI);
  if (bVar1) {
    pGVar2 = Data(in_RDI);
    if (pGVar2 == (GdlDefn *)0x0) {
      local_30 = (GdlLanguageDefn *)0x0;
    }
    else {
      local_30 = (GdlLanguageDefn *)
                 __dynamic_cast(pGVar2,&GdlDefn::typeinfo,&GdlLanguageDefn::typeinfo,0);
    }
    local_8 = local_30;
  }
  else {
    local_8 = (GdlLanguageDefn *)0x0;
  }
  return local_8;
}

Assistant:

GdlLanguageDefn * GrcSymbolTableEntry::LanguageDefnData()
{
	if (!HasData())
		return NULL;

	GdlLanguageDefn * plang = dynamic_cast<GdlLanguageDefn *>(Data());
	return plang;
}